

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::exceptions::parsing::~parsing(parsing *this)

{
  parsing *this_local;
  
  exception::~exception(&this->super_exception);
  return;
}

Assistant:

explicit parsing(const std::string& message)
  : exception(message)
  {
  }